

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

uint __thiscall OpenMD::SimInfo::getNLocalCutoffGroups(SimInfo *this)

{
  pointer ppCVar1;
  Molecule *pMVar2;
  pointer ppCVar3;
  CutoffGroup *pCVar4;
  int iVar5;
  MoleculeIterator local_20;
  
  local_20._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5 = 0;
  if ((_Rb_tree_header *)local_20._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header)
  {
    pMVar2 = (Molecule *)0x0;
  }
  else {
    pMVar2 = (Molecule *)local_20._M_node[1]._M_parent;
  }
  while (pMVar2 != (Molecule *)0x0) {
    ppCVar3 = (pMVar2->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (pMVar2->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar3 != ppCVar1) goto LAB_0012d2f9;
    pCVar4 = (CutoffGroup *)0x0;
    while (pCVar4 != (CutoffGroup *)0x0) {
      iVar5 = iVar5 + (int)((ulong)((long)(pCVar4->cutoffAtomList).
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pCVar4->cutoffAtomList).
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppCVar3 = ppCVar3 + 1;
      pCVar4 = (CutoffGroup *)0x0;
      if (ppCVar3 != ppCVar1) {
LAB_0012d2f9:
        pCVar4 = *ppCVar3;
      }
    }
    pMVar2 = nextMolecule(this,&local_20);
  }
  return (this->nAtoms_ - iVar5) + this->nCutoffGroups_;
}

Assistant:

unsigned int SimInfo::getNLocalCutoffGroups() {
    int nLocalCutoffAtoms = 0;
    Molecule* mol;
    MoleculeIterator mi;
    CutoffGroup* cg;
    Molecule::CutoffGroupIterator ci;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        nLocalCutoffAtoms += cg->getNumAtom();
      }
    }

    return nAtoms_ - nLocalCutoffAtoms + nCutoffGroups_;
  }